

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase576::run(TestCase576 *this)

{
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  Builder builder_01;
  ListElementCount LVar1;
  Orphanage OVar2;
  undefined8 in_stack_fffffffffffffc00;
  IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field> local_3f8;
  Field field;
  Builder root;
  BuilderFor<capnproto_test::capnp::test::TestAllTypes> dst;
  Builder local_358;
  Schema local_328;
  uint uStack_320;
  undefined4 uStack_31c;
  SegmentReader *local_318;
  CapTableReader *pCStack_310;
  void *local_308;
  WirePointer *pWStack_300;
  StructDataBitCount local_2f8;
  StructPointerCount SStack_2f4;
  undefined2 uStack_2f2;
  int iStack_2f0;
  undefined4 uStack_2ec;
  Schema local_2e8;
  uint uStack_2e0;
  undefined4 uStack_2dc;
  SegmentReader *local_2d8;
  CapTableReader *pCStack_2d0;
  void *local_2c8;
  WirePointer *pWStack_2c0;
  StructDataBitCount local_2b8;
  StructPointerCount SStack_2b4;
  undefined2 uStack_2b2;
  int iStack_2b0;
  undefined4 uStack_2ac;
  Builder local_2a0;
  Orphan<capnproto_test::capnp::test::TestAllTypes> dstOrphan;
  Orphan<capnp::DynamicValue> local_250;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  FieldList local_158;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            (&root,&builder.super_MessageBuilder);
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = root._builder.dataSize;
  builder_00._builder.pointerCount = root._builder.pointerCount;
  builder_00._builder._38_2_ = root._builder._38_2_;
  initTestMessage(builder_00);
  builder_01._builder.capTable = (CapTableBuilder *)local_3f8.container;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffc00;
  builder_01._builder.data._0_4_ = local_3f8.index;
  builder_01._builder.data._4_4_ = local_3f8._12_4_;
  builder_01._builder.pointers = (WirePointer *)field.parent.super_Schema.raw;
  builder_01._builder.dataSize = field.index;
  builder_01._builder.pointerCount = field._12_2_;
  builder_01._builder._38_2_ = field._14_2_;
  OVar2 = Orphanage::getForMessageContaining<capnproto_test::capnp::test::TestAllTypes::Builder>
                    (builder_01);
  field.parent.super_Schema.raw = (Schema)OVar2.arena;
  field._8_8_ = OVar2.capTable;
  Orphanage::newOrphan<capnproto_test::capnp::test::TestAllTypes>(&dstOrphan,(Orphanage *)&field);
  OrphanGetImpl<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::apply
            (&dst,&dstOrphan.builder);
  local_358.builder.dataSize = root._builder.dataSize;
  local_358.builder.pointerCount = root._builder.pointerCount;
  local_358.builder._38_2_ = root._builder._38_2_;
  local_358.builder.data = root._builder.data;
  local_358.builder.pointers = root._builder.pointers;
  local_358.builder.segment = root._builder.segment;
  local_358.builder.capTable = root._builder.capTable;
  local_358.schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  local_2a0.builder.dataSize = dst._builder.dataSize;
  local_2a0.builder.pointerCount = dst._builder.pointerCount;
  local_2a0.builder._38_2_ = dst._builder._38_2_;
  local_2a0.builder.data = dst._builder.data;
  local_2a0.builder.pointers = dst._builder.pointers;
  local_2a0.builder.segment = dst._builder.segment;
  local_2a0.builder.capTable = dst._builder.capTable;
  local_2a0.schema.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  field.parent.super_Schema.raw = (Schema)((long)schemas::s_a0a8f314b80b63fd + 0x48);
  StructSchema::getFields(&local_158,&field.parent);
  LVar1 = local_158.list.reader.elementCount;
  local_3f8.container = &local_158;
  for (local_3f8.index = 0; local_3f8.index != LVar1; local_3f8.index = local_3f8.index + 1) {
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              (&field,&local_3f8);
    local_2b8 = field.proto._reader.dataSize;
    SStack_2b4 = field.proto._reader.pointerCount;
    uStack_2b2 = field.proto._reader._38_2_;
    iStack_2b0 = field.proto._reader.nestingLimit;
    uStack_2ac = field.proto._reader._44_4_;
    local_2c8 = field.proto._reader.data;
    pWStack_2c0 = field.proto._reader.pointers;
    local_2d8 = field.proto._reader.segment;
    pCStack_2d0 = field.proto._reader.capTable;
    local_2e8 = field.parent.super_Schema.raw;
    uStack_2e0 = field.index;
    uStack_2dc = field._12_4_;
    field_00.index = field.index;
    field_00._12_4_ = field._12_4_;
    field_00.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
    field_00.proto._reader.segment = field.proto._reader.segment;
    field_00.proto._reader.capTable = field.proto._reader.capTable;
    field_00.proto._reader.data = field.proto._reader.data;
    field_00.proto._reader.pointers = field.proto._reader.pointers;
    field_00.proto._reader.dataSize = field.proto._reader.dataSize;
    field_00.proto._reader.pointerCount = field.proto._reader.pointerCount;
    field_00.proto._reader._38_2_ = field.proto._reader._38_2_;
    field_00.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
    field_00.proto._reader._44_4_ = field.proto._reader._44_4_;
    DynamicStruct::Builder::disown(&local_250,&local_358,field_00);
    field_01.index = uStack_2e0;
    field_01._12_4_ = uStack_2dc;
    field_01.parent.super_Schema.raw = (Schema)(Schema)local_2e8.raw;
    field_01.proto._reader.segment = local_2d8;
    field_01.proto._reader.capTable = pCStack_2d0;
    field_01.proto._reader.data = local_2c8;
    field_01.proto._reader.pointers = pWStack_2c0;
    field_01.proto._reader.dataSize = local_2b8;
    field_01.proto._reader.pointerCount = SStack_2b4;
    field_01.proto._reader._38_2_ = uStack_2b2;
    field_01.proto._reader.nestingLimit = iStack_2b0;
    field_01.proto._reader._44_4_ = uStack_2ac;
    DynamicStruct::Builder::adopt(&local_2a0,field_01,&local_250);
    OrphanBuilder::~OrphanBuilder(&local_250.builder);
  }
  StructBuilder::asReader(&root._builder);
  reader._reader.capTable = (CapTableReader *)uStack_180;
  reader._reader.segment = (SegmentReader *)local_188;
  reader._reader.data = (void *)local_178;
  reader._reader.pointers = (WirePointer *)uStack_170;
  reader._reader.dataSize = (undefined4)local_168;
  reader._reader.pointerCount = local_168._4_2_;
  reader._reader._38_2_ = local_168._6_2_;
  reader._reader._40_8_ = uStack_160;
  checkTestMessageAllZero(reader);
  StructBuilder::asReader(&dst._builder);
  reader_00._reader.capTable = (CapTableReader *)uStack_1b0;
  reader_00._reader.segment = (SegmentReader *)local_1b8;
  reader_00._reader.data = (void *)local_1a8;
  reader_00._reader.pointers = (WirePointer *)uStack_1a0;
  reader_00._reader.dataSize = (undefined4)local_198;
  reader_00._reader.pointerCount = local_198._4_2_;
  reader_00._reader._38_2_ = local_198._6_2_;
  reader_00._reader._40_8_ = uStack_190;
  checkTestMessage(reader_00);
  field.parent.super_Schema.raw = local_358.schema.super_Schema.raw;
  StructSchema::getFields(&local_158,&field.parent);
  local_3f8.container = &local_158;
  for (local_3f8.index = 0; local_3f8.index != local_158.list.reader.elementCount;
      local_3f8.index = local_3f8.index + 1) {
    IndexingIterator<const_capnp::StructSchema::FieldList,_capnp::StructSchema::Field>::operator*
              (&field,&local_3f8);
    local_2f8 = field.proto._reader.dataSize;
    SStack_2f4 = field.proto._reader.pointerCount;
    uStack_2f2 = field.proto._reader._38_2_;
    iStack_2f0 = field.proto._reader.nestingLimit;
    uStack_2ec = field.proto._reader._44_4_;
    local_308 = field.proto._reader.data;
    pWStack_300 = field.proto._reader.pointers;
    local_318 = field.proto._reader.segment;
    pCStack_310 = field.proto._reader.capTable;
    local_328 = field.parent.super_Schema.raw;
    uStack_320 = field.index;
    uStack_31c = field._12_4_;
    field_02.index = field.index;
    field_02._12_4_ = field._12_4_;
    field_02.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
    field_02.proto._reader.segment = field.proto._reader.segment;
    field_02.proto._reader.capTable = field.proto._reader.capTable;
    field_02.proto._reader.data = field.proto._reader.data;
    field_02.proto._reader.pointers = field.proto._reader.pointers;
    field_02.proto._reader.dataSize = field.proto._reader.dataSize;
    field_02.proto._reader.pointerCount = field.proto._reader.pointerCount;
    field_02.proto._reader._38_2_ = field.proto._reader._38_2_;
    field_02.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
    field_02.proto._reader._44_4_ = field.proto._reader._44_4_;
    DynamicStruct::Builder::disown(&local_250,&local_358,field_02);
    field_03.index = uStack_320;
    field_03._12_4_ = uStack_31c;
    field_03.parent.super_Schema.raw = (Schema)(Schema)local_328.raw;
    field_03.proto._reader.segment = local_318;
    field_03.proto._reader.capTable = pCStack_310;
    field_03.proto._reader.data = local_308;
    field_03.proto._reader.pointers = pWStack_300;
    field_03.proto._reader.dataSize = local_2f8;
    field_03.proto._reader.pointerCount = SStack_2f4;
    field_03.proto._reader._38_2_ = uStack_2f2;
    field_03.proto._reader.nestingLimit = iStack_2f0;
    field_03.proto._reader._44_4_ = uStack_2ec;
    DynamicStruct::Builder::adopt(&local_2a0,field_03,&local_250);
    OrphanBuilder::~OrphanBuilder(&local_250.builder);
  }
  StructBuilder::asReader(&root._builder);
  reader_01._reader.capTable = (CapTableReader *)uStack_1e0;
  reader_01._reader.segment = (SegmentReader *)local_1e8;
  reader_01._reader.data = (void *)local_1d8;
  reader_01._reader.pointers = (WirePointer *)uStack_1d0;
  reader_01._reader.dataSize = (undefined4)local_1c8;
  reader_01._reader.pointerCount = local_1c8._4_2_;
  reader_01._reader._38_2_ = local_1c8._6_2_;
  reader_01._reader._40_8_ = uStack_1c0;
  checkTestMessageAllZero(reader_01);
  StructBuilder::asReader(&dst._builder);
  reader_02._reader.capTable = (CapTableReader *)uStack_210;
  reader_02._reader.segment = (SegmentReader *)local_218;
  reader_02._reader.data = (void *)local_208;
  reader_02._reader.pointers = (WirePointer *)uStack_200;
  reader_02._reader.dataSize = (undefined4)local_1f8;
  reader_02._reader.pointerCount = local_1f8._4_2_;
  reader_02._reader._38_2_ = local_1f8._6_2_;
  reader_02._reader._40_8_ = uStack_1f0;
  checkTestMessageAllZero(reader_02);
  OrphanBuilder::~OrphanBuilder(&dstOrphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Orphans, DynamicDisown) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  Orphan<TestAllTypes> dstOrphan =
      Orphanage::getForMessageContaining(root).newOrphan<TestAllTypes>();
  auto dst = dstOrphan.get();

  DynamicStruct::Builder dynamic = root;
  DynamicStruct::Builder dynamicDst = dst;

  for (auto field: dynamic.getSchema().getFields()) {
    dynamicDst.adopt(field, dynamic.disown(field));
  }

  checkTestMessageAllZero(root.asReader());
  checkTestMessage(dst.asReader());

  for (auto field: dynamic.getSchema().getFields()) {
    dynamicDst.adopt(field, dynamic.disown(field));
  }

  checkTestMessageAllZero(root.asReader());
  checkTestMessageAllZero(dst.asReader());
}